

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O0

unsigned_long bitcrc32(unsigned_long c,void *_p,size_t s)

{
  char local_31;
  byte *pbStack_30;
  char bitctr;
  uchar *p;
  size_t s_local;
  void *_p_local;
  unsigned_long c_local;
  
  pbStack_30 = (byte *)_p;
  p = (uchar *)s;
  _p_local = (void *)c;
  if (_p == (void *)0x0) {
    c_local = 0;
  }
  else {
    for (; p != (uchar *)0x0; p = p + -1) {
      _p_local = (void *)((ulong)*pbStack_30 ^ (ulong)_p_local);
      for (local_31 = '\b'; '\0' < local_31; local_31 = local_31 + -1) {
        if (((ulong)_p_local & 1) == 0) {
          _p_local = (void *)((ulong)_p_local >> 1 ^ 0xedb88320);
        }
        else {
          _p_local = (void *)((ulong)_p_local >> 1);
        }
        _p_local = (void *)((ulong)_p_local ^ 0x80000000);
      }
      pbStack_30 = pbStack_30 + 1;
    }
    c_local = (unsigned_long)_p_local;
  }
  return c_local;
}

Assistant:

unsigned long
bitcrc32(unsigned long c, const void *_p, size_t s)
{
	/* This is a drop-in replacement for crc32() from zlib.
	 * Libarchive should be able to correctly read archives (including
	 * correct CRCs) even when zlib is unavailable, and this function
	 * helps us verify that. Yes, this is very, very slow and unsuitable
	 * for production use, but it's obviously correct, compact, and
	 * works well enough for this particular usage. Libarchive
	 * internally uses a much more efficient implementation if zlib is
	 * unavailable. */
	const unsigned char *p = _p;
	char bitctr;

	if (p == NULL)
		return (0);

	for (; s > 0; --s) {
		c ^= *p++;
		for (bitctr = 8; bitctr > 0; --bitctr) {
			if (c & 1) c = (c >> 1);
			else	   c = (c >> 1) ^ 0xedb88320;
			c ^= 0x80000000;
		}
	}
	return (c);
}